

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QSize __thiscall QDockWidgetGroupLayout::minimumSize(QDockWidgetGroupLayout *this)

{
  int iVar1;
  QSize QVar2;
  QSize QVar3;
  
  iVar1 = frameWidth(this);
  QVar2 = QDockAreaLayoutInfo::minimumSize(&this->layoutState);
  QVar3.ht.m_i = QVar2.ht.m_i.m_i + iVar1;
  QVar3.wd.m_i = QVar2.wd.m_i.m_i + iVar1;
  return QVar3;
}

Assistant:

QSize minimumSize() const override
    {
        int fw = frameWidth();
        return layoutState.minimumSize() + QSize(fw, fw);
    }